

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O1

void __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::SignalTimeDependent
          (SignalTimeDependent<double,_int> *this,function2<double_&,_double_&,_int> *t,
          SignalArray_const<int> *sig,string *name)

{
  undefined1 *this_00;
  pointer pcVar1;
  vtable_base *pvVar2;
  function_buffer *pfVar3;
  function2<double_&,_double_&,_int> local_70;
  string local_50;
  
  this_00 = &this->field_0x40;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + name->_M_string_length);
  Signal<double,_int>::Signal((Signal<double,_int> *)this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x128978;
  *(undefined8 *)&this->field_0x40 = 0x128ae8;
  TimeDependency<int>::TimeDependency
            (&this->super_TimeDependency<int>,(SignalBase<int> *)this_00,sig,TIME_DEPENDENT);
  (this->super_TimeDependency<int>)._vptr_TimeDependency = (_func_int **)0x128978;
  *(undefined8 *)&this->field_0x40 = 0x128ae8;
  local_70.super_function_base.vtable = (vtable_base *)0x0;
  pvVar2 = (t->super_function_base).vtable;
  if (pvVar2 != (vtable_base *)0x0) {
    pfVar3 = &(t->super_function_base).functor;
    local_70.super_function_base.vtable = pvVar2;
    if (((ulong)pvVar2 & 1) == 0) {
      (*pvVar2->manager)(pfVar3,&local_70.super_function_base.functor,clone_functor_tag);
    }
    else {
      local_70.super_function_base.functor._16_8_ =
           *(undefined8 *)((long)&(t->super_function_base).functor + 0x10);
      local_70.super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar3;
      local_70.super_function_base.functor._8_8_ =
           *(undefined8 *)((long)&(t->super_function_base).functor + 8);
    }
  }
  (**(code **)(*(long *)this_00 + 0xd8))(this_00,&local_70,0);
  boost::function2<double_&,_double_&,_int>::~function2(&local_70);
  return;
}

Assistant:

SignalTimeDependent<T, Time>::SignalTimeDependent(
    boost::function2<T &, T &, Time> t, const SignalArray_const<Time> &sig,
    std::string name)
    : Signal<T, Time>(name), TimeDependency<Time>(this, sig) {
  this->setFunction(t);
}